

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_scatter_acc2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv,void *alpha)

{
  size_t sVar1;
  long lVar2;
  logical lVar3;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  char err_string_2 [256];
  char err_string_1 [256];
  char err_string [256];
  Integer subscrpt [2];
  Integer *int_ptr;
  Integer type;
  Integer proc;
  Integer nelem;
  Integer first;
  Integer item_size;
  Integer k;
  Integer in_stack_fffffffffffffc78;
  Integer *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  Integer *in_stack_fffffffffffffc90;
  void *in_stack_fffffffffffffc98;
  Integer *in_stack_fffffffffffffca0;
  char local_278 [144];
  Integer in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char local_178 [256];
  undefined8 local_78;
  undefined8 local_70;
  void *local_68;
  long local_60;
  Integer *in_stack_ffffffffffffffa8;
  Integer *in_stack_ffffffffffffffb0;
  long lVar4;
  Integer in_stack_ffffffffffffffb8;
  long lVar5;
  long local_38;
  
  local_60 = (long)GA[in_RDI + 1000].type;
  if (0 < in_R8) {
    if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
      sprintf(local_178,"%s: INVALID ARRAY HANDLE","ga_scatter_acc");
      pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
    if (GA[in_RDI + 1000].actv == 0) {
      sprintf(local_278,"%s: ARRAY NOT ACTIVE","ga_scatter_acc");
      pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
    GAstat.numsca = GAstat.numsca + 1;
    local_68 = pnga_malloc((Integer)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                           (char *)in_stack_fffffffffffffc80);
    for (local_38 = 0; local_38 < in_R8; local_38 = local_38 + 1) {
      local_78 = *(undefined8 *)(in_RDX + local_38 * 8);
      local_70 = *(undefined8 *)(in_RCX + local_38 * 8);
      lVar3 = pnga_locate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8);
      if (lVar3 == 0) {
        sprintf(&stack0xfffffffffffffc88,"invalid i/j=(%ld,%ld)",
                *(undefined8 *)(in_RDX + local_38 * 8),*(undefined8 *)(in_RCX + local_38 * 8));
        pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
    }
    sVar1 = ga_types[local_60 + -1000].size;
    GAbytes.scatot = (double)(long)sVar1 * (double)in_R8 + GAbytes.scatot;
    ga_sort_scat(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                 (Integer *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    lVar5 = 0;
    do {
      lVar2 = *(long *)((long)local_68 + lVar5 * 8);
      lVar4 = 0;
      for (local_38 = lVar5;
          (local_38 < in_R8 && (lVar2 == *(long *)((long)local_68 + local_38 * 8)));
          local_38 = local_38 + 1) {
        lVar4 = lVar4 + 1;
      }
      if (lVar2 == GAme) {
        GAbytes.scaloc = (double)(long)sVar1 * (double)lVar4 + GAbytes.scaloc;
      }
      gai_scatter_acc_local
                (err_string_1._152_8_,(void *)err_string_1._144_8_,(Integer *)err_string_1._136_8_,
                 (Integer *)err_string_1._128_8_,err_string_1._120_8_,(void *)err_string_1._112_8_,
                 err_string_1._176_8_);
      lVar5 = lVar4 + lVar5;
    } while (lVar5 < in_R8);
    pnga_free((void *)0x20530f);
  }
  return;
}

Assistant:

void pnga_scatter_acc2d(g_a, v, i, j, nv, alpha)
     Integer g_a, nv, *i, *j;
     void *v, *alpha;
{
register Integer k;
Integer item_size;
Integer first, nelem, proc, type=GA[GA_OFFSET + g_a].type;
Integer *int_ptr;
Integer subscrpt[2];

  if (nv < 1) return;

  ga_check_handleM(g_a, "ga_scatter_acc");
  
  GAstat.numsca++;

  int_ptr = (Integer*) pnga_malloc(nv, MT_F_INT, "ga_scatter_acc--p");

  /* find proc that owns the (i,j) element; store it in temp: int_ptr */
  for(k=0; k< nv; k++) {
    subscrpt[0] = *(i+k);
    subscrpt[1] = *(j+k);
    if(! pnga_locate(g_a, subscrpt, int_ptr+k)){
         char err_string[ERR_STR_LEN];
         sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
         pnga_error(err_string,g_a);
    }
  }

  /* determine limit for message size --  v,i, & j will travel together */
  item_size = GAsizeofM(type);
  GAbytes.scatot += (double)item_size*nv ;

  /* Sort the entries by processor */
  ga_sort_scat(&nv, v, i, j, int_ptr, type );

  /* go through the list again executing scatter for each processor */

  first = 0;
  do {
      proc = int_ptr[first];
      nelem = 0;

      /* count entries for proc from "first" to last */
      for(k=first; k< nv; k++){
        if(proc == int_ptr[k]) nelem++;
        else break;
      }

      if(proc == GAme){
             GAbytes.scaloc += (double)item_size* nelem ;
      }

      gai_scatter_acc_local(g_a, ((char*)v)+item_size*first, i+first,
                           j+first, nelem, alpha, proc);
      first += nelem;

  }while (first< nv);

  pnga_free(int_ptr);

}